

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::BuildService
          (DescriptorBuilder *this,ServiceDescriptorProto *proto,void *param_2,
          ServiceDescriptor *result)

{
  int iVar1;
  Symbol symbol;
  string *full_name;
  string *psVar2;
  void *pvVar3;
  Type *proto_00;
  OptionsType *orig_options;
  long lVar4;
  long lVar5;
  undefined4 uStack_3c;
  
  full_name = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(this->file_ + 8));
  if (full_name->_M_string_length != 0) {
    std::__cxx11::string::_M_replace_aux((ulong)full_name,full_name->_M_string_length,0,'\x01');
  }
  std::__cxx11::string::_M_append
            ((char *)full_name,(ulong)(((proto->name_).ptr_)->_M_dataplus)._M_p);
  ValidateSymbolName(this,(proto->name_).ptr_,full_name,&proto->super_Message);
  psVar2 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)result = psVar2;
  *(string **)(result + 8) = full_name;
  *(FileDescriptor **)(result + 0x10) = this->file_;
  iVar1 = (proto->method_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x20) = iVar1;
  pvVar3 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar1 * 0x68);
  *(void **)(result + 0x28) = pvVar3;
  if (0 < (proto->method_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
                           (&(proto->method_).super_RepeatedPtrFieldBase,(int)lVar5);
      BuildMethod(this,proto_00,result,(MethodDescriptor *)(*(long *)(result + 0x28) + lVar4));
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x68;
    } while (lVar5 < (proto->method_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (((proto->_has_bits_).has_bits_[0] & 2) == 0) {
    *(undefined8 *)(result + 0x18) = 0;
  }
  else {
    orig_options = proto->options_;
    if (orig_options == (OptionsType *)0x0) {
      orig_options = (OptionsType *)&_ServiceOptions_default_instance_;
    }
    AllocateOptionsImpl<google::protobuf::ServiceDescriptor>
              (this,*(string **)(result + 8),*(string **)(result + 8),orig_options,result);
  }
  symbol._4_4_ = uStack_3c;
  symbol.type = 6;
  symbol.field_1.service_descriptor = result;
  AddSymbol(this,*(string **)(result + 8),(void *)0x0,*(string **)result,&proto->super_Message,
            symbol);
  return;
}

Assistant:

void DescriptorBuilder::BuildService(const ServiceDescriptorProto& proto,
                                     const void* /* dummy */,
                                     ServiceDescriptor* result) {
  string* full_name = tables_->AllocateString(file_->package());
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_      = tables_->AllocateString(proto.name());
  result->full_name_ = full_name;
  result->file_      = file_;

  BUILD_ARRAY(proto, result, method, BuildMethod, result);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), NULL, result->name(),
            proto, Symbol(result));
}